

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O1

int ASN1_object_size(int constructed,int length,int tag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  if (length < 0) {
    return -1;
  }
  iVar2 = 1;
  if (0x1e < tag) {
    iVar2 = 1;
    do {
      iVar2 = iVar2 + 1;
      bVar1 = 0x7f < (uint)tag;
      tag = (uint)tag >> 7;
    } while (bVar1);
  }
  if (constructed == 2) {
    iVar2 = iVar2 + 3;
  }
  else {
    iVar2 = iVar2 + 1;
    uVar4 = length;
    if (0x7f < length) {
      do {
        iVar2 = iVar2 + 1;
        bVar1 = 0xff < uVar4;
        uVar4 = uVar4 >> 8;
      } while (bVar1);
    }
  }
  iVar3 = -1;
  if (iVar2 < (int)(length ^ 0x7fffffffU)) {
    iVar3 = iVar2 + length;
  }
  return iVar3;
}

Assistant:

int ASN1_object_size(int constructed, int length, int tag) {
  int ret = 1;
  if (length < 0) {
    return -1;
  }
  if (tag >= 31) {
    while (tag > 0) {
      tag >>= 7;
      ret++;
    }
  }
  if (constructed == 2) {
    ret += 3;
  } else {
    ret++;
    if (length > 127) {
      int tmplen = length;
      while (tmplen > 0) {
        tmplen >>= 8;
        ret++;
      }
    }
  }
  if (ret >= INT_MAX - length) {
    return -1;
  }
  return ret + length;
}